

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_alloc_path_table(archive_write *a,vdd *vdd,int max_depth)

{
  path_table *ppVar1;
  int local_28;
  int i;
  int max_depth_local;
  vdd *vdd_local;
  archive_write *a_local;
  
  vdd->max_depth = max_depth;
  ppVar1 = (path_table *)malloc((long)vdd->max_depth << 5);
  vdd->pathtbl = ppVar1;
  if (vdd->pathtbl == (path_table *)0x0) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
    a_local._4_4_ = -0x1e;
  }
  else {
    for (local_28 = 0; local_28 < vdd->max_depth; local_28 = local_28 + 1) {
      vdd->pathtbl[local_28].first = (isoent *)0x0;
      vdd->pathtbl[local_28].last = &vdd->pathtbl[local_28].first;
      vdd->pathtbl[local_28].sorted = (isoent **)0x0;
      vdd->pathtbl[local_28].cnt = 0;
    }
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
isoent_alloc_path_table(struct archive_write *a, struct vdd *vdd,
    int max_depth)
{
	int i;

	vdd->max_depth = max_depth;
	vdd->pathtbl = malloc(sizeof(*vdd->pathtbl) * vdd->max_depth);
	if (vdd->pathtbl == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	for (i = 0; i < vdd->max_depth; i++) {
		vdd->pathtbl[i].first = NULL;
		vdd->pathtbl[i].last = &(vdd->pathtbl[i].first);
		vdd->pathtbl[i].sorted = NULL;
		vdd->pathtbl[i].cnt = 0;
	}
	return (ARCHIVE_OK);
}